

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O1

Matrix3d *
opengv::relative_pose::modules::eigensolver::composeM
          (Matrix3d *__return_storage_ptr__,Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,
          Matrix3d *yzF,Matrix3d *zxF,cayley_t *cayley)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  ActualDstType actualDst;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  double dVar63;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  rotation_t R;
  double local_438;
  double local_430;
  double local_3c8;
  double local_3c0;
  ulong local_3b8;
  double local_3b0;
  double local_3a8;
  double local_3a0;
  double local_398;
  double local_390;
  double local_388;
  
  math::cayley2rot_reduced(cayley);
  auVar123._8_8_ = 0;
  auVar123._0_8_ = local_3a0;
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar136._8_8_ = 0;
  auVar136._0_8_ = local_3b8;
  auVar34 = vmulsd_avx512f(auVar136,auVar34);
  dVar29 = local_3a0 *
           (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[1];
  auVar121._8_8_ = 0;
  auVar121._0_8_ = local_388;
  dVar2 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [2];
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar35 = vmulsd_avx512f(auVar136,auVar35);
  dVar30 = local_3a0 *
           (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[4];
  dVar3 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [5];
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = local_3b8;
  auVar36 = vmulsd_avx512f(auVar137,auVar36);
  dVar31 = local_3a0 *
           (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[7];
  dVar4 = (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [8];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = auVar34._0_8_ + dVar29 + local_388 * dVar2;
  auVar37 = vmulsd_avx512f(auVar137,auVar51);
  dVar26 = auVar37._0_8_ +
           local_3a0 * (auVar35._0_8_ + dVar30 + local_388 * dVar3) +
           local_388 * (auVar36._0_8_ + dVar31 + local_388 * dVar4);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] = dVar26;
  auVar37 = vmulsd_avx512f(auVar137,ZEXT816(0xc000000000000000));
  dVar5 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [0];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar5;
  dVar6 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [1];
  dVar7 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [2];
  auVar104._8_8_ = 0;
  auVar104._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  dVar63 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[4];
  auVar111._8_8_ = 0;
  auVar111._0_8_ = dVar63;
  auVar38 = vmulsd_avx512f(auVar37,auVar104);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = local_3a0 * -2.0;
  auVar39 = vmulsd_avx512f(auVar89,auVar111);
  dVar8 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [5];
  auVar115._8_8_ = 0;
  auVar115._0_8_ = dVar8;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = local_388 * -2.0;
  auVar40 = vmulsd_avx512f(auVar118,auVar115);
  auVar39 = vaddsd_avx512f(auVar39,auVar40);
  auVar38 = vaddsd_avx512f(auVar38,auVar39);
  vmovsd_avx512f(auVar38);
  auVar129._8_8_ = 0;
  auVar129._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar39 = vmulsd_avx512f(auVar37,auVar129);
  auVar143._8_8_ = 0;
  auVar143._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar40 = vmulsd_avx512f(auVar89,auVar143);
  auVar166._8_8_ = 0;
  auVar166._0_8_ =
       (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar41 = vmulsd_avx512f(auVar118,auVar166);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = auVar37._0_8_ * dVar5 + local_388 * -2.0 * dVar7 + local_3a0 * -2.0 * dVar6;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = local_3c0;
  auVar37 = vmulsd_avx512f(auVar76,auVar151);
  auVar154._8_8_ = 0;
  auVar154._0_8_ = local_3a8;
  auVar38 = vmulsd_avx512f(auVar38,auVar154);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = auVar39._0_8_ + auVar41._0_8_ + auVar40._0_8_;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = local_390;
  auVar39 = vmulsd_avx512f(auVar72,auVar158);
  dVar26 = dVar26 + auVar37._0_8_ + auVar38._0_8_ + auVar39._0_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] = dVar26;
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar37 = vmulsd_avx512f(auVar151,auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar38 = vmulsd_avx512f(auVar154,auVar38);
  auVar150._8_8_ = 0;
  auVar150._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar39 = vmulsd_avx512f(auVar158,auVar150);
  auVar39 = vaddsd_avx512f(auVar38,auVar39);
  auVar42 = vaddsd_avx512f(auVar37,auVar39);
  vmovsd_avx512f(auVar42);
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = local_3a8;
  auVar39 = vmulsd_avx512f(auVar155,auVar39);
  auVar141._8_8_ = 0;
  auVar141._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = local_390;
  auVar40 = vmulsd_avx512f(auVar159,auVar141);
  auVar41 = vaddsd_avx512f(auVar39,auVar40);
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = local_3c0;
  auVar40 = vmulsd_avx512f(auVar152,auVar40);
  auVar43 = vaddsd_avx512f(auVar40,auVar41);
  vmovsd_avx512f(auVar43);
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar41 = vmulsd_avx512f(auVar155,auVar41);
  dVar5 = (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [8];
  auVar106._8_8_ = 0;
  auVar106._0_8_ = dVar5;
  auVar44 = vmulsd_avx512f(auVar159,auVar106);
  auVar45 = vaddsd_avx512f(auVar41,auVar44);
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar44 = vmulsd_avx512f(auVar152,auVar44);
  auVar45 = vaddsd_avx512f(auVar44,auVar45);
  auVar43 = vmulsd_avx512f(auVar155,auVar43);
  auVar45 = vmulsd_avx512f(auVar159,auVar45);
  auVar43 = vaddsd_avx512f(auVar43,auVar45);
  auVar42 = vmulsd_avx512f(auVar152,auVar42);
  auVar42 = vaddsd_avx512f(auVar42,auVar43);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = dVar26;
  auVar42 = vaddsd_avx512f(auVar119,auVar42);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] = auVar42._0_8_;
  auVar42 = vmulsd_avx512f(auVar137,auVar52);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = local_3b8;
  auVar43 = vmulsd_avx512f(auVar138,auVar104);
  auVar45 = vmulsd_avx512f(auVar138,auVar129);
  auVar46 = vmulsd_avx512f(auVar123,auVar143);
  auVar47 = vmulsd_avx512f(auVar121,auVar166);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = auVar42._0_8_ + local_3a0 * dVar6 + local_388 * dVar7;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = local_3c8;
  auVar42 = vmulsd_avx512f(auVar53,auVar125);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = auVar43._0_8_ + local_3a0 * dVar63 + local_388 * dVar8;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = local_3b0;
  auVar43 = vmulsd_avx512f(auVar97,auVar130);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = auVar45._0_8_ + auVar47._0_8_ + auVar46._0_8_;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = local_398;
  auVar45 = vmulsd_avx512f(auVar101,auVar144);
  dVar27 = auVar42._0_8_ + auVar43._0_8_ + auVar45._0_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[3] = dVar27;
  auVar77._8_8_ = 0x8000000000000000;
  auVar77._0_8_ = 0x8000000000000000;
  auVar112._0_8_ = -local_388;
  auVar112._8_8_ = 0x8000000000000000;
  dVar6 = (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [2];
  dVar32 = local_3a0 *
           (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[1];
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar42 = vmulsd_avx512f(auVar138,auVar42);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = auVar112._0_8_ * dVar6 - dVar32;
  auVar47 = vsubsd_avx512f(auVar98,auVar42);
  auVar167._8_8_ = 0;
  auVar167._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar45 = vmulsd_avx512f(auVar167,auVar112);
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar43 = vmulsd_avx512f(auVar123,auVar43);
  auVar48 = vsubsd_avx512f(auVar45,auVar43);
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar45 = vmulsd_avx512f(auVar138,auVar45);
  dVar7 = (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [8];
  dVar33 = local_3a0 *
           (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[7];
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar46 = vmulsd_avx512f(auVar138,auVar46);
  auVar47 = vmulsd_avx512f(auVar138,auVar47);
  dVar27 = dVar27 + auVar47._0_8_ +
                    local_3a0 * (auVar48._0_8_ - auVar45._0_8_) +
                    local_388 * ((auVar112._0_8_ * dVar7 - dVar33) - auVar46._0_8_);
  auVar47 = vxorpd_avx512vl(auVar159,auVar77);
  auVar48 = vmulsd_avx512f(auVar150,auVar47);
  auVar38 = vsubsd_avx512f(auVar48,auVar38);
  auVar37 = vsubsd_avx512f(auVar38,auVar37);
  auVar38 = vmulsd_avx512f(auVar141,auVar47);
  auVar38 = vsubsd_avx512f(auVar38,auVar39);
  auVar38 = vsubsd_avx512f(auVar38,auVar40);
  auVar38 = vmulsd_avx512f(auVar38,auVar130);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = (dVar5 * auVar47._0_8_ - auVar41._0_8_) - auVar44._0_8_;
  auVar39 = vmulsd_avx512f(auVar90,auVar144);
  auVar37 = vmulsd_avx512f(auVar37,auVar125);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[3] = dVar27;
  dVar27 = auVar37._0_8_ + auVar38._0_8_ + auVar39._0_8_ + dVar27;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[3] = dVar27;
  dVar5 = (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [1];
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar5;
  auVar37 = vmulsd_avx512f(auVar155,auVar54);
  auVar78._8_8_ = 0;
  auVar78._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = local_390;
  auVar38 = vmulsd_avx512f(auVar160,auVar78);
  dVar63 = (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
  auVar163._8_8_ = 0;
  auVar163._0_8_ = dVar63;
  auVar39 = vmulsd_avx512f(auVar152,auVar163);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = auVar39._0_8_ + auVar37._0_8_ + auVar38._0_8_;
  auVar38 = vmulsd_avx512f(auVar138,auVar91);
  dVar8 = (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [4];
  auVar79._8_8_ = 0;
  auVar79._0_8_ = dVar8;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = local_3a8;
  auVar40 = vmulsd_avx512f(auVar156,auVar79);
  auVar80._8_8_ = 0;
  auVar80._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar41 = vmulsd_avx512f(auVar160,auVar80);
  dVar26 = (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[3];
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar26;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = local_3c0;
  auVar44 = vmulsd_avx512f(auVar153,auVar81);
  auVar109._8_8_ = 0;
  auVar109._0_8_ = auVar40._0_8_ + auVar41._0_8_;
  auVar41 = vaddsd_avx512f(auVar44,auVar109);
  dVar9 = (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [7];
  auVar82._8_8_ = 0;
  auVar82._0_8_ = dVar9;
  auVar48 = vmulsd_avx512f(auVar156,auVar82);
  auVar83._8_8_ = 0;
  auVar83._0_8_ =
       (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar49 = vmulsd_avx512f(auVar160,auVar83);
  auVar49 = vaddsd_avx512f(auVar48,auVar49);
  dVar10 = (zxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[6];
  auVar84._8_8_ = 0;
  auVar84._0_8_ = dVar10;
  auVar50 = vmulsd_avx512f(auVar153,auVar84);
  auVar49 = vaddsd_avx512f(auVar50,auVar49);
  auVar49 = vmulsd_avx512f(auVar121,auVar49);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = local_3a0 * auVar41._0_8_;
  auVar41 = vaddsd_avx512f(auVar110,auVar49);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[3] = dVar27 + auVar41._0_8_ + auVar38._0_8_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = dVar32 + local_388 * dVar6;
  auVar38 = vaddsd_avx512f(auVar42,auVar73);
  auVar41 = vmulsd_avx512f(auVar121,auVar167);
  auVar41 = vaddsd_avx512f(auVar43,auVar41);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = auVar45._0_8_ + auVar41._0_8_;
  auVar41 = vmulsd_avx512f(auVar156,auVar92);
  auVar99._8_8_ = 0;
  auVar99._0_8_ = auVar46._0_8_ + dVar33 + local_388 * dVar7;
  auVar42 = vmulsd_avx512f(auVar160,auVar99);
  auVar38 = vmulsd_avx512f(auVar153,auVar38);
  dVar32 = auVar38._0_8_ + auVar41._0_8_ + auVar42._0_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[6] = dVar32;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = (auVar112._0_8_ * dVar2 - dVar29) - auVar34._0_8_;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = local_3c8;
  auVar34 = vmulsd_avx512f(auVar93,auVar126);
  auVar100._8_8_ = 0;
  auVar100._0_8_ = (auVar112._0_8_ * dVar3 - dVar30) - auVar35._0_8_;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = local_3b0;
  auVar35 = vmulsd_avx512f(auVar100,auVar131);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = (auVar112._0_8_ * dVar4 - dVar31) - auVar36._0_8_;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = local_398;
  auVar36 = vmulsd_avx512f(auVar85,auVar145);
  dVar32 = auVar34._0_8_ + auVar35._0_8_ + auVar36._0_8_ + dVar32;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[6] = dVar32;
  auVar34 = vmulsd_avx512f(auVar78,auVar47);
  auVar35 = vmulsd_avx512f(auVar80,auVar47);
  vmovsd_avx512f(auVar80);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = auVar35._0_8_ - auVar40._0_8_;
  auVar35 = vsubsd_avx512f(auVar64,auVar44);
  auVar36 = vmulsd_avx512f(auVar83,auVar47);
  vmovsd_avx512f(auVar83);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = auVar36._0_8_ - auVar48._0_8_;
  auVar36 = vsubsd_avx512f(auVar86,auVar50);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = (auVar34._0_8_ - auVar37._0_8_) - auVar39._0_8_;
  auVar34 = vmulsd_avx512f(auVar153,auVar55);
  auVar35 = vmulsd_avx512f(auVar156,auVar35);
  auVar36 = vmulsd_avx512f(auVar160,auVar36);
  dVar32 = dVar32 + auVar34._0_8_ + auVar35._0_8_ + auVar36._0_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[6] = dVar32;
  dVar2 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [0];
  dVar3 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [1];
  auVar122._8_8_ = 0;
  auVar122._0_8_ = local_390;
  dVar4 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [2];
  dVar6 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [3];
  dVar7 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
          [4];
  dVar27 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[5];
  dVar29 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[6];
  dVar30 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[7];
  dVar31 = (yzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[8];
  auVar65._8_8_ = 0;
  auVar65._0_8_ = local_3c0 * dVar2 + local_3a8 * dVar3 + local_390 * dVar4;
  auVar34 = vmulsd_avx512f(auVar126,auVar65);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = local_3c0 * dVar6 + local_3a8 * dVar7 + local_390 * dVar27;
  auVar35 = vmulsd_avx512f(auVar131,auVar94);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = local_3c0 * dVar29 + local_390 * dVar31 + local_3a8 * dVar30;
  auVar36 = vmulsd_avx512f(auVar145,auVar102);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[6] = dVar32 + auVar34._0_8_ + auVar35._0_8_ + auVar36._0_8_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar34 = vmulsd_avx512f(auVar126,auVar47);
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar35 = vmulsd_avx512f(auVar131,auVar48);
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar36 = vmulsd_avx512f(auVar145,auVar49);
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar37 = vmulsd_avx512f(auVar126,auVar50);
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar38 = vmulsd_avx512f(auVar131,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar39 = vmulsd_avx512f(auVar145,auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = local_3c8;
  auVar40 = vmulsd_avx512f(auVar127,auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = local_3b0;
  auVar41 = vmulsd_avx512f(auVar132,auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       (zzF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = local_398;
  auVar44 = vmulsd_avx512f(auVar146,auVar20);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = auVar34._0_8_ + auVar35._0_8_ + auVar36._0_8_;
  auVar34 = vmulsd_avx512f(auVar127,auVar56);
  auVar66._8_8_ = 0;
  auVar66._0_8_ = auVar37._0_8_ + auVar38._0_8_ + auVar39._0_8_;
  auVar35 = vmulsd_avx512f(auVar132,auVar66);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = auVar40._0_8_ + auVar41._0_8_ + auVar44._0_8_;
  auVar36 = vmulsd_avx512f(auVar146,auVar95);
  dVar28 = auVar34._0_8_ + auVar35._0_8_ + auVar36._0_8_;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = local_3c8;
  auVar38 = ZEXT816(0xc000000000000000);
  auVar34 = vmulsd_avx512f(auVar96,auVar38);
  auVar35 = vmulsd_avx512f(auVar163,auVar34);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = local_3b0;
  auVar36 = vmulsd_avx512f(auVar103,auVar38);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar5;
  auVar37 = vmulsd_avx512f(auVar36,auVar21);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = local_398;
  auVar38 = vmulsd_avx512f(auVar105,auVar38);
  auVar39 = vmulsd_avx512f(auVar78,auVar38);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = dVar8;
  auVar40 = vmulsd_avx512f(auVar113,auVar36);
  auVar41 = vmulsd_avx512f(auVar80,auVar38);
  auVar139._8_8_ = 0;
  auVar139._0_8_ = dVar26;
  auVar44 = vmulsd_avx512f(auVar139,auVar34);
  auVar124._8_8_ = 0;
  auVar124._0_8_ = dVar9;
  auVar42 = vmulsd_avx512f(auVar124,auVar36);
  auVar43 = vmulsd_avx512f(auVar83,auVar38);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = dVar10;
  auVar45 = vmulsd_avx512f(auVar128,auVar34);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = auVar44._0_8_ + auVar40._0_8_ + auVar41._0_8_;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = local_3a0;
  auVar40 = vmulsd_avx512f(auVar107,auVar147);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = auVar45._0_8_ + auVar42._0_8_ + auVar43._0_8_;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = local_388;
  auVar41 = vmulsd_avx512f(auVar116,auVar172);
  auVar67._8_8_ = 0;
  auVar67._0_8_ = auVar37._0_8_ + auVar39._0_8_ + auVar35._0_8_;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = local_3b8;
  auVar35 = vmulsd_avx512f(auVar67,auVar133);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[4] = dVar28;
  dVar28 = dVar28 + auVar40._0_8_ + auVar41._0_8_ + auVar35._0_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[4] = dVar28;
  dVar26 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[1];
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar26;
  auVar35 = vmulsd_avx512f(auVar147,auVar57);
  dVar10 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[2];
  auVar170._8_8_ = 0;
  auVar170._0_8_ = dVar10;
  auVar37 = vmulsd_avx512f(auVar172,auVar170);
  auVar37 = vaddsd_avx512f(auVar35,auVar37);
  dVar32 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar32;
  auVar39 = vmulsd_avx512f(auVar133,auVar58);
  auVar37 = vaddsd_avx512f(auVar39,auVar37);
  dVar33 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[4];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar33;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = local_3a0;
  auVar40 = vmulsd_avx512f(auVar148,auVar59);
  dVar11 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[5];
  auVar168._8_8_ = 0;
  auVar168._0_8_ = dVar11;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = local_388;
  auVar41 = vmulsd_avx512f(auVar173,auVar168);
  auVar41 = vaddsd_avx512f(auVar40,auVar41);
  dVar12 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[3];
  auVar60._8_8_ = 0;
  auVar60._0_8_ = dVar12;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = local_3b8;
  auVar44 = vmulsd_avx512f(auVar134,auVar60);
  dVar13 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[7];
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar13;
  auVar42 = vmulsd_avx512f(auVar148,auVar68);
  dVar14 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[8];
  auVar161._8_8_ = 0;
  auVar161._0_8_ = dVar14;
  auVar43 = vmulsd_avx512f(auVar173,auVar161);
  dVar15 = (xxF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[6];
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar15;
  auVar45 = vmulsd_avx512f(auVar134,auVar61);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = auVar44._0_8_ + auVar41._0_8_;
  auVar41 = vmulsd_avx512f(auVar148,auVar74);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = auVar45._0_8_ + auVar42._0_8_ + auVar43._0_8_;
  auVar43 = vmulsd_avx512f(auVar173,auVar69);
  auVar37 = vmulsd_avx512f(auVar134,auVar37);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[4] = dVar28 + auVar37._0_8_ + auVar41._0_8_ + auVar43._0_8_;
  auVar37 = vmulsd_avx512f(auVar78,auVar105);
  auVar164._8_8_ = 0;
  auVar164._0_8_ = dVar63;
  auVar41 = vmulsd_avx512f(auVar164,auVar96);
  auVar43 = vmulsd_avx512f(auVar139,auVar96);
  auVar46 = vmulsd_avx512f(auVar128,auVar96);
  dVar5 = local_3c0 * (auVar41._0_8_ + local_3b0 * dVar5 + auVar37._0_8_) +
          local_3a8 * (auVar43._0_8_ + dVar8 * local_3b0 + local_398 * local_430) +
          local_390 * (auVar46._0_8_ + dVar9 * local_3b0 + local_398 * local_438);
  auVar37 = vxorpd_avx512vl(auVar105,auVar77);
  dVar63 = auVar37._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar7;
  auVar37 = vmulsd_avx512f(auVar103,auVar22);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = dVar63 * dVar27;
  auVar37 = vsubsd_avx512f(auVar87,auVar37);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar6;
  auVar41 = vmulsd_avx512f(auVar96,auVar23);
  auVar37 = vsubsd_avx512f(auVar37,auVar41);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar30;
  auVar41 = vmulsd_avx512f(auVar103,auVar24);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = dVar63 * dVar31;
  auVar41 = vsubsd_avx512f(auVar70,auVar41);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar29;
  auVar43 = vmulsd_avx512f(auVar96,auVar25);
  auVar41 = vsubsd_avx512f(auVar41,auVar43);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[7] = dVar5;
  dVar5 = dVar5 + local_3c8 * ((dVar63 * dVar4 - local_3b0 * dVar3) - local_3c8 * dVar2) +
                  local_3b0 * auVar37._0_8_ + local_398 * auVar41._0_8_;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[7] = dVar5;
  auVar37 = vxorpd_avx512vl(auVar173,auVar77);
  auVar41 = vmulsd_avx512f(auVar170,auVar37);
  auVar35 = vsubsd_avx512f(auVar41,auVar35);
  auVar35 = vsubsd_avx512f(auVar35,auVar39);
  auVar39 = vmulsd_avx512f(auVar168,auVar37);
  auVar39 = vsubsd_avx512f(auVar39,auVar40);
  auVar37 = vmulsd_avx512f(auVar161,auVar37);
  dVar5 = dVar5 + local_3c0 * auVar35._0_8_ +
                  local_3a8 * (auVar39._0_8_ - auVar44._0_8_) +
                  local_390 * ((auVar37._0_8_ - auVar42._0_8_) - auVar45._0_8_);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[7] = dVar5;
  auVar62._8_8_ = 0;
  auVar62._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
  ;
  auVar88._8_8_ = 0;
  auVar88._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
  ;
  auVar35 = vmulsd_avx512f(auVar134,auVar62);
  auVar37 = vmulsd_avx512f(auVar148,auVar88);
  auVar114._8_8_ = 0;
  auVar114._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
  ;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = local_388;
  auVar39 = vmulsd_avx512f(auVar174,auVar114);
  auVar71._8_8_ = 0;
  auVar71._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
  ;
  auVar117._8_8_ = 0;
  auVar117._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
  ;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = local_3b8;
  auVar40 = vmulsd_avx512f(auVar135,auVar71);
  auVar149._8_8_ = 0;
  auVar149._0_8_ = local_3a0;
  auVar41 = vmulsd_avx512f(auVar149,auVar117);
  auVar142._8_8_ = 0;
  auVar142._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
  ;
  auVar44 = vmulsd_avx512f(auVar174,auVar142);
  auVar41 = vaddsd_avx512f(auVar41,auVar44);
  auVar40 = vaddsd_avx512f(auVar40,auVar41);
  auVar140._8_8_ = 0;
  auVar140._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
  ;
  auVar41 = vmulsd_avx512f(auVar149,auVar140);
  auVar157._8_8_ = 0;
  auVar157._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
  ;
  auVar44 = vmulsd_avx512f(auVar174,auVar157);
  auVar41 = vaddsd_avx512f(auVar41,auVar44);
  auVar165._8_8_ = 0;
  auVar165._0_8_ =
       (xyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
  ;
  auVar44 = vmulsd_avx512f(auVar135,auVar165);
  auVar41 = vaddsd_avx512f(auVar44,auVar41);
  auVar41 = vmulsd_avx512f(auVar105,auVar41);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = auVar40._0_8_ * local_3b0;
  auVar40 = vaddsd_avx512f(auVar120,auVar41);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar5;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = (auVar37._0_8_ + auVar39._0_8_ + auVar35._0_8_) * local_3c8 + auVar40._0_8_;
  auVar35 = vaddsd_avx512f(auVar75,auVar108);
  auVar171._8_8_ = 0;
  auVar171._0_8_ = dVar10;
  auVar37 = vmulsd_avx512f(auVar122,auVar171);
  auVar169._8_8_ = 0;
  auVar169._0_8_ = dVar11;
  auVar39 = vmulsd_avx512f(auVar122,auVar169);
  auVar162._8_8_ = 0;
  auVar162._0_8_ = dVar14;
  auVar40 = vmulsd_avx512f(auVar122,auVar162);
  dVar2 = local_3c0 * (local_3c0 * dVar32 + auVar37._0_8_ + local_3a8 * dVar26) +
          (local_3c0 * dVar12 + local_3a8 * dVar33 + auVar39._0_8_) * local_3a8 +
          local_390 * (local_3c0 * dVar15 + local_3a8 * dVar13 + auVar40._0_8_);
  auVar37 = vmulsd_avx512f(auVar36,auVar88);
  auVar39 = vmulsd_avx512f(auVar38,auVar114);
  auVar40 = vmulsd_avx512f(auVar34,auVar62);
  auVar41 = vmulsd_avx512f(auVar36,auVar117);
  auVar44 = vmulsd_avx512f(auVar38,auVar142);
  auVar42 = vmulsd_avx512f(auVar34,auVar71);
  auVar34 = vmulsd_avx512f(auVar34,auVar165);
  auVar36 = vmulsd_avx512f(auVar36,auVar140);
  auVar38 = vmulsd_avx512f(auVar38,auVar157);
  pdVar1 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
           m_storage.m_data.array + 7;
  vmovsd_avx512f(auVar35);
  *pdVar1 = *pdVar1;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[8] = dVar2;
  dVar2 = dVar2 + local_3c0 * (auVar40._0_8_ + auVar37._0_8_ + auVar39._0_8_) +
                  local_3a8 * (auVar42._0_8_ + auVar41._0_8_ + auVar44._0_8_) +
                  local_390 * (auVar34._0_8_ + auVar38._0_8_ + auVar36._0_8_);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[8] = dVar2;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[8] =
       dVar2 + (local_3c8 *
                (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[0] +
               local_3b0 *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[1] +
               local_398 *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[2]) * local_3c8 +
               (local_3c8 *
                (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[3] +
               local_3b0 *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[4] +
               local_398 *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[5]) * local_3b0 +
               (local_3c8 *
                (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data
                .array[6] +
               local_3b0 *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[7] +
               local_398 *
               (yyF->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
               array[8]) * local_398;
  dVar2 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
          m_storage.m_data.array[6];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[1] =
       (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
       m_storage.m_data.array[3];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[2] = dVar2;
  pdVar1 = (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
           m_storage.m_data.array + 5;
  vmovsd_avx512f(auVar35);
  *pdVar1 = *pdVar1;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix3d
opengv::relative_pose::modules::eigensolver::composeM(
  const Eigen::Matrix3d & xxF,
  const Eigen::Matrix3d & yyF,
  const Eigen::Matrix3d & zzF,
  const Eigen::Matrix3d & xyF,
  const Eigen::Matrix3d & yzF,
  const Eigen::Matrix3d & zxF,
  const cayley_t & cayley)
{
  Eigen::Matrix3d M;
  rotation_t R = math::cayley2rot_reduced(cayley);

  //Fill the matrix M using the precomputed summation terms
  double temp;
  temp =      R.row(2)*yyF*R.row(2).transpose();
  M(0,0)  = temp;
  temp = -2.0*R.row(2)*yzF*R.row(1).transpose();
  M(0,0) += temp;
  temp =      R.row(1)*zzF*R.row(1).transpose();
  M(0,0) += temp;

  temp =      R.row(2)*yzF*R.row(0).transpose();
  M(0,1)  = temp;
  temp = -1.0*R.row(2)*xyF*R.row(2).transpose();
  M(0,1) += temp;
  temp = -1.0*R.row(1)*zzF*R.row(0).transpose();
  M(0,1) += temp;
  temp =      R.row(1)*zxF*R.row(2).transpose();
  M(0,1) += temp;

  temp =      R.row(2)*xyF*R.row(1).transpose();
  M(0,2)  = temp;
  temp = -1.0*R.row(2)*yyF*R.row(0).transpose();
  M(0,2) += temp;
  temp = -1.0*R.row(1)*zxF*R.row(1).transpose();
  M(0,2) += temp;
  temp =      R.row(1)*yzF*R.row(0).transpose();
  M(0,2) += temp;

  temp =      R.row(0)*zzF*R.row(0).transpose();
  M(1,1)  = temp;
  temp = -2.0*R.row(0)*zxF*R.row(2).transpose();
  M(1,1) += temp;
  temp =      R.row(2)*xxF*R.row(2).transpose();
  M(1,1) += temp;

  temp =      R.row(0)*zxF*R.row(1).transpose();
  M(1,2)  = temp;
  temp = -1.0*R.row(0)*yzF*R.row(0).transpose();
  M(1,2) += temp;
  temp = -1.0*R.row(2)*xxF*R.row(1).transpose();
  M(1,2) += temp;
  temp =      R.row(2)*xyF*R.row(0).transpose();
  M(1,2) += temp;

  temp =      R.row(1)*xxF*R.row(1).transpose();
  M(2,2)  = temp;
  temp = -2.0*R.row(0)*xyF*R.row(1).transpose();
  M(2,2) += temp;
  temp =      R.row(0)*yyF*R.row(0).transpose();
  M(2,2) += temp;

  M(1,0) = M(0,1);
  M(2,0) = M(0,2);
  M(2,1) = M(1,2);

  return M;
}